

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O2

pair<double,_double> __thiscall
anurbs::NurbsSurfaceGeometry<2L>::greville_point
          (NurbsSurfaceGeometry<2L> *this,Index index_u,Index index_v)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Index i;
  long lVar3;
  double dVar4;
  pair<double,_double> pVar5;
  double local_30;
  double local_28;
  
  local_30 = 0.0;
  lVar3 = 0;
  while( true ) {
    iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
    if (CONCAT44(extraout_var,iVar1) <= lVar3) break;
    dVar4 = knot_u(this,index_u + lVar3);
    local_30 = local_30 + dVar4;
    lVar3 = lVar3 + 1;
  }
  iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
  local_28 = 0.0;
  lVar3 = 0;
  while( true ) {
    iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
    if (CONCAT44(extraout_var_01,iVar2) <= lVar3) break;
    dVar4 = knot_v(this,index_v + lVar3);
    local_28 = local_28 + dVar4;
    lVar3 = lVar3 + 1;
  }
  iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  pVar5.second = local_28 / (double)CONCAT44(extraout_var_02,iVar2);
  pVar5.first = local_30 / (double)CONCAT44(extraout_var_00,iVar1);
  return pVar5;
}

Assistant:

std::pair<double, double> greville_point(Index index_u, Index index_v) const
    {
        double u = 0.0;
        double v = 0.0;

        for (Index i = 0; i < degree_u(); i++) {
            u += knot_u(index_u + i);
        }

        u /= degree_u();

        for (Index i = 0; i < degree_v(); i++) {
            v += knot_v(index_v + i);
        }

        v /= degree_v();

        return {u, v};
    }